

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::AddXcFrameworkItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  undefined8 __args;
  bool bVar1;
  __type _Var2;
  uint uVar3;
  cmXcFrameworkPlist *this_00;
  ulong uVar4;
  char local_1ca [2];
  string local_1c8;
  cmListFileBacktrace local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_178;
  undefined1 local_148 [8];
  LinkEntry libraryEntry;
  undefined1 local_d8 [8];
  string libraryPath;
  string local_b0;
  FeatureDescriptor *local_90;
  void *local_88;
  void *local_80;
  ItemIsPath local_78 [4];
  cmXcFrameworkPlistLibrary *local_68;
  cmXcFrameworkPlistLibrary *lib;
  undefined1 local_58 [8];
  optional<cmXcFrameworkPlist> plist;
  LinkEntry *entry_local;
  cmComputeLinkInformation *this_local;
  
  plist.super__Optional_base<cmXcFrameworkPlist,_false,_false>._M_payload.
  super__Optional_payload<cmXcFrameworkPlist,_true,_false,_false>.
  super__Optional_payload_base<cmXcFrameworkPlist>._56_8_ = entry;
  cmParseXcFrameworkPlist
            ((optional<cmXcFrameworkPlist> *)local_58,(string *)entry,this->Makefile,
             &(entry->Item).Backtrace);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_58);
  if (bVar1) {
    this_00 = std::optional<cmXcFrameworkPlist>::operator->
                        ((optional<cmXcFrameworkPlist> *)local_58);
    local_68 = cmXcFrameworkPlist::SelectSuitableLibrary
                         (this_00,this->Makefile,
                          (cmListFileBacktrace *)
                          (plist.super__Optional_base<cmXcFrameworkPlist,_false,_false>._M_payload.
                           super__Optional_payload<cmXcFrameworkPlist,_true,_false,_false>.
                           super__Optional_payload_base<cmXcFrameworkPlist>._56_8_ + 0x20));
    if (local_68 != (cmXcFrameworkPlistLibrary *)0x0) {
      uVar3 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x29])();
      __args = plist.super__Optional_base<cmXcFrameworkPlist,_false,_false>._M_payload.
               super__Optional_payload<cmXcFrameworkPlist,_true,_false,_false>.
               super__Optional_payload_base<cmXcFrameworkPlist>._56_8_;
      if ((uVar3 & 1) == 0) {
        libraryEntry.Feature.field_2._M_local_buf[0xf] = '/';
        libraryEntry.Feature.field_2._M_local_buf[0xe] = '/';
        cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                  ((string *)local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   plist.super__Optional_base<cmXcFrameworkPlist,_false,_false>._M_payload.
                   super__Optional_payload<cmXcFrameworkPlist,_true,_false,_false>.
                   super__Optional_payload_base<cmXcFrameworkPlist>._56_8_,
                   libraryEntry.Feature.field_2._M_local_buf + 0xf,&local_68->LibraryIdentifier,
                   libraryEntry.Feature.field_2._M_local_buf + 0xe,&local_68->LibraryPath);
        std::__cxx11::string::string((string *)&local_198,(string *)local_d8);
        cmListFileBacktrace::cmListFileBacktrace
                  (&local_1a8,
                   (cmListFileBacktrace *)
                   (plist.super__Optional_base<cmXcFrameworkPlist,_false,_false>._M_payload.
                    super__Optional_payload<cmXcFrameworkPlist,_true,_false,_false>.
                    super__Optional_payload_base<cmXcFrameworkPlist>._56_8_ + 0x20));
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                  (&local_178,&local_198,&local_1a8);
        cmComputeLinkDepends::LinkEntry::LinkEntry
                  ((LinkEntry *)local_148,&local_178,
                   *(cmGeneratorTarget **)
                    (plist.super__Optional_base<cmXcFrameworkPlist,_false,_false>._M_payload.
                     super__Optional_payload<cmXcFrameworkPlist,_true,_false,_false>.
                     super__Optional_payload_base<cmXcFrameworkPlist>._56_8_ + 0x30));
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                  (&local_178);
        cmListFileBacktrace::~cmListFileBacktrace(&local_1a8);
        std::__cxx11::string::~string((string *)&local_198);
        bVar1 = cmSystemTools::IsPathToFramework((string *)local_d8);
        if ((bVar1) && (bVar1 = cmGeneratorTarget::IsApple(this->Target), bVar1)) {
          AddFrameworkItem(this,(LinkEntry *)local_148);
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->Depends,(value_type *)local_d8);
          AddFullItem(this,(LinkEntry *)local_148);
          AddLibraryRuntimeInfo(this,(string *)local_d8);
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            local_1ca[1] = 0x2f;
            local_1ca[0] = '/';
            cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                      (&local_1c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       plist.super__Optional_base<cmXcFrameworkPlist,_false,_false>._M_payload.
                       super__Optional_payload<cmXcFrameworkPlist,_true,_false,_false>.
                       super__Optional_payload_base<cmXcFrameworkPlist>._56_8_,local_1ca + 1,
                       &local_68->LibraryIdentifier,local_1ca,&local_68->HeadersPath);
            AddXcFrameworkHeaderPath(this,&local_1c8);
            std::__cxx11::string::~string((string *)&local_1c8);
          }
        }
        cmComputeLinkDepends::LinkEntry::~LinkEntry((LinkEntry *)local_148);
        std::__cxx11::string::~string((string *)local_d8);
      }
      else {
        local_78[0] = Yes;
        local_80 = (void *)0x0;
        local_88 = (void *)0x0;
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(plist.super__Optional_base<cmXcFrameworkPlist,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<cmXcFrameworkPlist,_true,_false,_false>.
                                  super__Optional_payload_base<cmXcFrameworkPlist>._56_8_ + 0x48),
                                (anonymous_namespace)::DEFAULT_abi_cxx11_);
        libraryPath.field_2._M_local_buf[0xe] = '\0';
        if (_Var2) {
          std::allocator<char>::allocator();
          libraryPath.field_2._M_local_buf[0xe] = '\x01';
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b0,"__CMAKE_LINK_XCFRAMEWORK",
                     (allocator<char> *)(libraryPath.field_2._M_local_buf + 0xf));
        }
        else {
          std::__cxx11::string::string
                    ((string *)&local_b0,
                     (string *)
                     (plist.super__Optional_base<cmXcFrameworkPlist,_false,_false>._M_payload.
                      super__Optional_payload<cmXcFrameworkPlist,_true,_false,_false>.
                      super__Optional_payload_base<cmXcFrameworkPlist>._56_8_ + 0x48));
        }
        local_90 = FindLibraryFeature(this,&local_b0);
        std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
        emplace_back<std::__cxx11::string_const&,cmComputeLinkInformation::ItemIsPath,decltype(nullptr),decltype(nullptr),cmComputeLinkInformation::FeatureDescriptor_const*>
                  ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                    *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __args,local_78,&local_80,&local_88,&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        if ((libraryPath.field_2._M_local_buf[0xe] & 1U) != 0) {
          std::allocator<char>::~allocator
                    ((allocator<char> *)(libraryPath.field_2._M_local_buf + 0xf));
        }
      }
    }
    lib._4_4_ = 0;
  }
  else {
    lib._4_4_ = 1;
  }
  std::optional<cmXcFrameworkPlist>::~optional((optional<cmXcFrameworkPlist> *)local_58);
  return;
}

Assistant:

void cmComputeLinkInformation::AddXcFrameworkItem(LinkEntry const& entry)
{
  auto plist = cmParseXcFrameworkPlist(entry.Item.Value, *this->Makefile,
                                       entry.Item.Backtrace);
  if (!plist) {
    return;
  }

  if (auto const* lib =
        plist->SelectSuitableLibrary(*this->Makefile, entry.Item.Backtrace)) {
    if (this->GlobalGenerator->IsXcode()) {
      this->Items.emplace_back(
        entry.Item.Value, ItemIsPath::Yes, nullptr, nullptr,
        this->FindLibraryFeature(entry.Feature == DEFAULT
                                   ? "__CMAKE_LINK_XCFRAMEWORK"
                                   : entry.Feature));
    } else {
      auto libraryPath = cmStrCat(
        entry.Item.Value, '/', lib->LibraryIdentifier, '/', lib->LibraryPath);
      LinkEntry libraryEntry(
        BT<std::string>(libraryPath, entry.Item.Backtrace), entry.Target);

      if (cmSystemTools::IsPathToFramework(libraryPath) &&
          this->Target->IsApple()) {
        // This is a framework.
        this->AddFrameworkItem(libraryEntry);
      } else {
        this->Depends.push_back(libraryPath);
        this->AddFullItem(libraryEntry);
        this->AddLibraryRuntimeInfo(libraryPath);
        if (!lib->HeadersPath.empty()) {
          this->AddXcFrameworkHeaderPath(cmStrCat(entry.Item.Value, '/',
                                                  lib->LibraryIdentifier, '/',
                                                  lib->HeadersPath));
        }
      }
    }
  }
}